

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall SummedArea_Constant_Test::TestBody(SummedArea_Constant_Test *this)

{
  allocator_type allocator;
  float *pfVar1;
  Allocator alloc;
  int y;
  int y_00;
  char *pcVar2;
  int x;
  int x_00;
  undefined1 auVar3 [16];
  Tuple2<pbrt::Point2,_float> local_98;
  Bounds2<float> local_90;
  AssertionResult gtest_ar;
  Float local_6c;
  Tuple2<pbrt::Point2,_float> local_68;
  Tuple2<pbrt::Point2,_float> local_60;
  SummedAreaTable sat;
  Array2D<float> v;
  
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Array2D<float>::Array2D(&v,4,4,allocator);
  for (y_00 = 0;
      y_00 < v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
             v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y; y_00 = y_00 + 1) {
    for (x_00 = 0;
        x_00 < v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
               v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x; x_00 = x_00 + 1) {
      pfVar1 = pbrt::Array2D<float>::operator()(&v,x_00,y_00);
      *pfVar1 = 1.0;
    }
  }
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::SummedAreaTable::SummedAreaTable(&sat,&v,alloc);
  auVar3._8_4_ = 0x3f800000;
  auVar3._0_8_ = 0x3f8000003f800000;
  auVar3._12_4_ = 0x3f800000;
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_68.x = 1.4013e-45;
  local_60 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3);
  pbrt::Bounds2<float>::Bounds2(&local_90,(Point2<float> *)&local_98,(Point2<float> *)&local_60);
  local_6c = pbrt::SummedAreaTable::Integral(&sat,&local_90);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"1","sat.Integral(Bounds2f(Point2f(0, 0), Point2f(1, 1)))",
             (int *)&local_68,&local_6c);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_98.x = 0.0;
  local_98.y = 1.75;
  local_68.x = 1.0;
  local_68.y = 0.5;
  pbrt::Bounds2<float>::Bounds2(&local_90,(Point2<float> *)&local_60,(Point2<float> *)&local_68);
  local_6c = pbrt::SummedAreaTable::Integral(&sat,&local_90);
  testing::internal::CmpHelperEQ<double,float>
            ((internal *)&gtest_ar,"0.5","sat.Integral(Bounds2f(Point2f(0, 0), Point2f(1, 0.5)))",
             (double *)&local_98,&local_6c);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_98.x = 0.0;
  local_98.y = 1.75;
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_68.x = 0.5;
  local_68.y = 1.0;
  pbrt::Bounds2<float>::Bounds2(&local_90,(Point2<float> *)&local_60,(Point2<float> *)&local_68);
  local_6c = pbrt::SummedAreaTable::Integral(&sat,&local_90);
  testing::internal::CmpHelperEQ<double,float>
            ((internal *)&gtest_ar,"0.5","sat.Integral(Bounds2f(Point2f(0, 0), Point2f(0.5, 1)))",
             (double *)&local_98,&local_6c);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_98.x = 0.0;
  local_98.y = 1.5625;
  local_68.x = 0.25;
  local_68.y = 0.75;
  pbrt::Bounds2<float>::Bounds2(&local_90,(Point2<float> *)&local_60,(Point2<float> *)&local_68);
  local_6c = pbrt::SummedAreaTable::Integral(&sat,&local_90);
  testing::internal::CmpHelperEQ<double,float>
            ((internal *)&gtest_ar,"3. / 16.",
             "sat.Integral(Bounds2f(Point2f(0, 0), Point2f(.25, .75)))",(double *)&local_98,
             &local_6c);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_98.x = 0.0;
  local_98.y = 1.5625;
  local_60.x = 0.5;
  local_60.y = 0.25;
  local_68.x = 0.75;
  local_68.y = 1.0;
  pbrt::Bounds2<float>::Bounds2(&local_90,(Point2<float> *)&local_60,(Point2<float> *)&local_68);
  local_6c = pbrt::SummedAreaTable::Integral(&sat,&local_90);
  testing::internal::CmpHelperEQ<double,float>
            ((internal *)&gtest_ar,"3. / 16.",
             "sat.Integral(Bounds2f(Point2f(0.5, 0.25), Point2f(0.75, 1)))",(double *)&local_98,
             &local_6c);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pbrt::Array2D<double>::~Array2D(&sat.sum);
  pbrt::Array2D<float>::~Array2D(&v);
  return;
}

Assistant:

TEST(Sampling, SmoothStep) {
    Float start = SampleSmoothStep(0, 10, 20);
    // Fairly high slop since lots of values close to the start are close
    // to zero.
    EXPECT_LT(std::abs(start - 10), .1) << start;

    Float end = SampleSmoothStep(1, -10, -5);
    EXPECT_LT(std::abs(end - -5), 1e-5) << end;

    Float mid = SampleSmoothStep(0.5, 0, 1);
    // Solved this numericalla in Mathematica.
    EXPECT_LT(std::abs(mid - 0.733615), 1e-5) << mid;

    for (Float u : Uniform1D(1000)) {
        Float x = SampleSmoothStep(u, -3, 5);
        Float ratio = SmoothStep(x, -3, 5) / SmoothStepPDF(x, -3, 5);
        // SmoothStep over [-3,5] integrates to 4.
        EXPECT_LT(std::abs(ratio - 4), 1e-5) << ratio;

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };
        EXPECT_FALSE(checkErr(u, InvertSmoothStepSample(x, -3, 5)));
    }

    auto ss = [](Float v) { return SmoothStep(v, 0, 1); };
    auto values = Sample1DFunction(ss, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100, 62351)) {
        Float cx = SampleSmoothStep(u, 0, 1);
        Float cp = SmoothStepPDF(cx, 0, 1);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}